

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_image.h
# Opt level: O2

void __thiscall
dlib::image_view<dlib::array2d<float,_dlib::memory_manager_stateless_kernel_1<char>_>_>::image_view
          (image_view<dlib::array2d<float,_dlib::memory_manager_stateless_kernel_1<char>_>_> *this,
          array2d<float,_dlib::memory_manager_stateless_kernel_1<char>_> *img)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  float *pfVar3;
  
  iVar2 = (*(img->super_enumerable<float>)._vptr_enumerable[8])(img);
  pfVar3 = (float *)CONCAT44(extraout_var,iVar2);
  if (pfVar3 != (float *)0x0) {
    pfVar3 = img->data;
  }
  this->_data = (char *)pfVar3;
  lVar1 = img->nc_;
  this->_width_step = lVar1 * 4;
  this->_nr = img->nr_;
  this->_nc = lVar1;
  this->_img = img;
  return;
}

Assistant:

image_view(
            image_type& img
        ) : 
            _data((char*)image_data(img)), 
            _width_step(width_step(img)),
            _nr(num_rows(img)),
            _nc(num_columns(img)),
            _img(&img) 
        {}